

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

int sweepstep(lua_State *L,global_State *g,int nextstate,GCObject **nextlist)

{
  long lVar1;
  int count;
  int local_1c;
  
  if (g->sweepgc == (GCObject **)0x0) {
    local_1c = 0;
    g->gcstate = (lu_byte)nextstate;
  }
  else {
    lVar1 = g->GCdebt;
    nextlist = sweeplist(L,g->sweepgc,100,&local_1c);
    g->GCestimate = g->GCestimate + (g->GCdebt - lVar1);
  }
  g->sweepgc = nextlist;
  return local_1c;
}

Assistant:

static int sweepstep (lua_State *L, global_State *g,
                      int nextstate, GCObject **nextlist) {
  if (g->sweepgc) {
    l_mem olddebt = g->GCdebt;
    int count;
    g->sweepgc = sweeplist(L, g->sweepgc, GCSWEEPMAX, &count);
    g->GCestimate += g->GCdebt - olddebt;  /* update estimate */
    return count;
  }
  else {  /* enter next state */
    g->gcstate = nextstate;
    g->sweepgc = nextlist;
    return 0;  /* no work done */
  }
}